

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

string * gnuplotio::Gnuplot::get_default_cmd_abi_cxx11_(void)

{
  char *__s;
  allocator<char> *__a;
  string *in_RDI;
  allocator<char> local_a;
  allocator<char> local_9;
  
  __s = getenv("GNUPLOT_IOSTREAM_CMD");
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    __s = "gnuplot -persist";
    __a = &local_a;
  }
  else {
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,__a);
  return in_RDI;
}

Assistant:

static std::string get_default_cmd() {
        GNUPLOT_MSVC_WARNING_4996_PUSH
        char *from_env = std::getenv("GNUPLOT_IOSTREAM_CMD");
        GNUPLOT_MSVC_WARNING_4996_POP
        if(from_env && from_env[0]) {
            return from_env;
        } else {
            return GNUPLOT_DEFAULT_COMMAND;
        }
    }